

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O3

array<unsigned_long,_6UL> * __thiscall
Omega_h::Overlay::get_cell_faces
          (array<unsigned_long,_6UL> *__return_storage_ptr__,Overlay *this,size_t cell)

{
  int *piVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  Alloc *this_00;
  Adj AStack_58;
  
  Omega_h::Mesh::get_adj(&AStack_58,&this->mesh,3,2);
  pvVar2 = AStack_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  this_00 = AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if ((((ulong)AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
       AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
         (AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
    this_00 = (Alloc *)((AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  AStack_58.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
  AStack_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Adj::~Adj(&AStack_58);
  lVar3 = (cell << 0x21) * 3;
  lVar4 = 0;
  do {
    __return_storage_ptr__->_M_elems[lVar4] = (long)*(int *)((long)pvVar2 + (lVar3 >> 0x1e));
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x100000000;
  } while (lVar4 != 6);
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<size_t, 6> Overlay::get_cell_faces(size_t cell) const {
  std::array<size_t, 6> faces;
  auto cells2faces = mesh.get_adj(REGION, FACE).ab2b;
  for (size_t i = 0; i < 6; ++i) {
    faces[i] = size_t(cells2faces[LO(cell * 6 + i)]);
  }
  return faces;
}